

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall
Fossilize::DatabaseInterface::import_metadata_from_os_handle
          (DatabaseInterface *this,intptr_t handle)

{
  bool bVar1;
  LogLevel LVar2;
  int iVar3;
  void *data_;
  bool ret;
  void *mapped;
  stat s;
  int fd;
  intptr_t handle_local;
  DatabaseInterface *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this->impl);
  if ((bVar1) ||
     (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->impl->blacklist), bVar1))
  {
    LVar2 = get_thread_log_level();
    if (((int)LVar2 < 3) &&
       (bVar1 = Internal::log_thread_callback
                          (LOG_ERROR,
                           "Cannot use imported metadata along with white- or blacklists.\n"),
       !bVar1)) {
      fprintf(_stderr,
              "Fossilize ERROR: Cannot use imported metadata along with white- or blacklists.\n");
    }
    this_local._7_1_ = false;
  }
  else {
    s.__glibc_reserved[2]._4_4_ = (int)handle;
    memset(&mapped,0,0x90);
    iVar3 = fstat(s.__glibc_reserved[2]._4_4_,(stat *)&mapped);
    if (iVar3 < 0) {
      this_local._7_1_ = false;
    }
    else if (s.st_rdev == 0) {
      this_local._7_1_ = false;
    }
    else {
      data_ = mmap((void *)0x0,s.st_rdev,1,1,s.__glibc_reserved[2]._4_4_,0);
      if (data_ == (void *)0xffffffffffffffff) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = Impl::parse_imported_metadata(this->impl,data_,s.st_rdev);
        if (this_local._7_1_) {
          close(s.__glibc_reserved[2]._4_4_);
        }
        else {
          munmap(data_,s.st_rdev);
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DatabaseInterface::import_metadata_from_os_handle(intptr_t handle)
{
	if (impl->whitelist || impl->blacklist)
	{
		LOGE_LEVEL("Cannot use imported metadata along with white- or blacklists.\n");
		return false;
	}

#ifdef _WIN32
	HANDLE mapping_handle = reinterpret_cast<HANDLE>(handle);
	void *mapped = MapViewOfFile(mapping_handle, FILE_MAP_READ, 0, 0, 0);
	if (!mapped)
		return false;

	// There is no documented way to query size of a file mapping handle in Windows (?!?!), so rely on parsing the metadata.
	// As long as we find valid records within the bounds of the VirtualQuery, we will be fine.
	MEMORY_BASIC_INFORMATION info;
	if (!VirtualQuery(mapped, &info, sizeof(info)))
	{
		UnmapViewOfFile(mapped);
		return false;
	}

	bool ret = impl->parse_imported_metadata(mapped, info.RegionSize);
	if (ret)
		CloseHandle(mapping_handle);
	else
		UnmapViewOfFile(mapped);
	return ret;
#else
	int fd = int(handle);
	struct stat s = {};
	if (fstat(fd, &s) < 0)
		return false;

	if (s.st_size == 0)
		return false;

	void *mapped = mmap(nullptr, s.st_size, PROT_READ, MAP_SHARED, fd, 0);
	if (mapped == MAP_FAILED)
		return false;

	bool ret = impl->parse_imported_metadata(mapped, s.st_size);
	if (ret)
		close(fd);
	else
		munmap(mapped, s.st_size);

	return ret;
#endif
}